

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randtilegen.cpp
# Opt level: O0

void copy_tile_data(uchar (*destination) [8],uchar (*source) [8])

{
  unsigned_long_long uVar1;
  unsigned_long_long uVar2;
  uint local_28;
  uint local_24;
  uint x;
  uint y;
  uint ymask;
  uint xmask;
  uchar (*source_local) [8];
  uchar (*destination_local) [8];
  
  uVar1 = getRandomBits(1);
  uVar2 = getRandomBits(1);
  for (local_24 = 0; local_24 < 8; local_24 = local_24 + 1) {
    for (local_28 = 0; local_28 < 8; local_28 = local_28 + 1) {
      destination[local_24][local_28] = source[local_24 ^ (int)uVar2 * 7][local_28 ^ (int)uVar1 * 7]
      ;
    }
  }
  return;
}

Assistant:

static void
    copy_tile_data(unsigned char destination[ARR_QUALS(restrict) MIN_NB_ELMS(8)][8],
                   unsigned char /* const */ source[ARR_QUALS(restrict) MIN_NB_ELMS(8)][8]) {
	// Apply a random rotation to the copy
	// coord ^ 7 = inverted coordinate; coord ^ 0 = regular coordinate
	unsigned xmask = getRandomBits(1) * 7;
	unsigned ymask = getRandomBits(1) * 7;
	for (unsigned y = 0; y < 8; y++) {
		for (unsigned x = 0; x < 8; x++) {
			destination[y][x] = source[y ^ ymask][x ^ xmask];
		}
	}
}